

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_reset(sqlite3_stmt *pStmt)

{
  uint uVar1;
  sqlite3 *db;
  
  if (pStmt == (sqlite3_stmt *)0x0) {
    uVar1 = 0;
  }
  else {
    if (*(sqlite3_mutex **)(*(long *)pStmt + 0x18) != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(*(sqlite3_mutex **)(*(long *)pStmt + 0x18));
    }
    uVar1 = sqlite3VdbeReset((Vdbe *)pStmt);
    *(undefined4 *)(pStmt + 0x84) = 0;
    *(undefined2 *)(pStmt + 0x8a) = 0xff02;
    *(undefined4 *)(pStmt + 0x44) = 0xbdf20da3;
    *(undefined4 *)(pStmt + 0x90) = 0;
    *(undefined8 *)(pStmt + 0x7c) = 0xffffffff00000001;
    *(undefined4 *)(pStmt + 0x9c) = 0;
    *(undefined8 *)(pStmt + 200) = 0;
    db = *(sqlite3 **)pStmt;
    if ((uVar1 == 0xc0a) || (db->mallocFailed != '\0')) {
      apiOomError(db);
      db = *(sqlite3 **)pStmt;
      uVar1 = 7;
    }
    else {
      uVar1 = uVar1 & db->errMask;
    }
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
    }
  }
  return uVar1;
}

Assistant:

SQLITE_STDCALL sqlite3_reset(sqlite3_stmt *pStmt){
  int rc;
  if( pStmt==0 ){
    rc = SQLITE_OK;
  }else{
    Vdbe *v = (Vdbe*)pStmt;
    sqlite3_mutex_enter(v->db->mutex);
    rc = sqlite3VdbeReset(v);
    sqlite3VdbeRewind(v);
    assert( (rc & (v->db->errMask))==rc );
    rc = sqlite3ApiExit(v->db, rc);
    sqlite3_mutex_leave(v->db->mutex);
  }
  return rc;
}